

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp.cpp
# Opt level: O1

void mg::data::mzp_write(Mzp *mzp,string *out)

{
  int iVar1;
  int iVar2;
  pointer pbVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  undefined1 local_48 [8];
  vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
  entry_headers;
  
  out->_M_string_length = 0;
  *(out->_M_dataplus)._M_p = '\0';
  iVar1 = *(int *)&(mzp->entry_headers).
                   super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
  iVar2 = *(int *)&(mzp->entry_headers).
                   super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = 0;
  std::__cxx11::string::resize((ulong)out,'\b');
  *(ulong *)(out->_M_dataplus)._M_p = (ulong)(uint)(iVar1 - iVar2) << 0x2d | 0x30306467726d;
  lVar9 = (long)(mzp->entry_headers).
                super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish +
          (8 - (long)(mzp->entry_headers).
                     super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                     ._M_impl.super__Vector_impl_data._M_start);
  std::vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>::
  vector((vector<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_> *)
         local_48,&mzp->entry_headers);
  lVar5 = (long)(mzp->entry_headers).
                super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(mzp->entry_headers).
                super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                ._M_impl.super__Vector_impl_data._M_start;
  if (lVar5 != 0) {
    pbVar3 = (mzp->entry_data).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 1;
    lVar7 = 0;
    uVar10 = 0;
    do {
      uVar8 = *(ulong *)((long)&pbVar3->_M_string_length + lVar7 * 4);
      *(short *)((long)(uint16_t *)local_48 + lVar7) = (short)(uVar10 >> 0xb);
      *(ushort *)((long)((long)local_48 + 2) + lVar7) = (ushort)uVar10 & 0x7ff;
      *(ushort *)((long)((long)local_48 + 4) + lVar7) =
           ((short)(uVar8 >> 0xb) + 1) - (ushort)((uVar8 & 0x7ff) == 0);
      *(short *)((long)((long)local_48 + 6) + lVar7) = (short)uVar8;
      uVar10 = uVar8 + uVar10;
      uVar8 = (ulong)uVar6;
      lVar7 = lVar7 + 8;
      uVar6 = uVar6 + 1;
    } while (uVar8 < (ulong)(lVar5 >> 3));
  }
  std::__cxx11::string::resize((ulong)out,(char)uVar10 + (char)lVar9);
  if ((mzp->entry_headers).
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (mzp->entry_headers).
      super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar10 = 0;
    uVar8 = 1;
    do {
      *(MzpArchiveEntry *)((out->_M_dataplus)._M_p + uVar10 * 8 + 8) =
           *(pointer)((long)local_48 + uVar10 * 8);
      pbVar3 = (mzp->entry_data).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      memcpy((out->_M_dataplus)._M_p +
             (ulong)((pointer)((long)local_48 + uVar10 * 8))->sector_offset * 0x800 +
             (ulong)((pointer)((long)local_48 + uVar10 * 8))->byte_offset + lVar9,
             pbVar3[uVar10]._M_dataplus._M_p,pbVar3[uVar10]._M_string_length);
      bVar4 = uVar8 < (ulong)((long)(mzp->entry_headers).
                                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(mzp->entry_headers).
                                    super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3);
      uVar10 = uVar8;
      uVar8 = (ulong)((int)uVar8 + 1);
    } while (bVar4);
  }
  if (local_48 != (undefined1  [8])0x0) {
    operator_delete((void *)local_48,
                    (long)entry_headers.
                          super__Vector_base<mg::data::Mzp::MzpArchiveEntry,_std::allocator<mg::data::Mzp::MzpArchiveEntry>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)local_48);
  }
  return;
}

Assistant:

void mzp_write(const Mzp &mzp, std::string &out) {
  // Clear output
  out.clear();

  // Write header
  Mzp::MzpArchiveHeader header;
  memcpy(header.magic, Mzp::FILE_MAGIC, sizeof(Mzp::MzpArchiveHeader::magic));
  header.archive_entry_count = mzp.entry_headers.size();
  header.to_file_order();
  out.resize(sizeof(header));
  memcpy(&out[0], &header, sizeof(header));

  // Calculate the data segment start
  std::string::size_type data_segment_start =
      sizeof(Mzp::MzpArchiveHeader) +
      sizeof(Mzp::MzpArchiveEntry) * mzp.entry_headers.size();

  // Clone the header data so that we can recalculate it
  std::vector<Mzp::MzpArchiveEntry> entry_headers = mzp.entry_headers;
  std::string::size_type current_data_offset = 0;
  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    Mzp::MzpArchiveEntry &entry_header = entry_headers[i];
    auto &entry_data = mzp.entry_data[i];
    const std::string::size_type entry_size = entry_data.size();
    entry_header.set_offsets(current_data_offset);
    entry_header.set_data_size(entry_size);
    current_data_offset += entry_size;
    // Pad current data offset to 16 byte boundary
    // const std::string::size_type real_data_end_addr =
    //     data_segment_start + current_data_offset;
    // current_data_offset += 16 - (real_data_end_addr % 16);
  }

  // Calculate total file size
  const std::string::size_type output_size =
      data_segment_start + current_data_offset;
  out.resize(output_size, 0xFF);

  // Write out each datum pair, since we need to use the header to get the
  // correct data offset
  for (unsigned i = 0; i < mzp.entry_headers.size(); i++) {
    // Convert header to file order and emit
    auto &entry_header = entry_headers[i];
    entry_header.to_file_order();
    const std::string::size_type header_output_offset =
        sizeof(Mzp::MzpArchiveHeader) + sizeof(Mzp::MzpArchiveEntry) * i;
    memcpy(&out[header_output_offset], &entry_header, sizeof(entry_header));

    // Insert data at data start + data offset
    auto &entry_data = mzp.entry_data[i];
    memcpy(&out[data_segment_start + entry_header.data_offset_relative()],
           entry_data.data(), entry_data.size());
  }
}